

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O1

bool __thiscall duckdb::PivotRef::Equals(PivotRef *this,TableRef *other_p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  size_t __n;
  bool bVar1;
  int iVar2;
  PivotRef *pPVar3;
  pointer pTVar4;
  type pTVar5;
  const_reference this_00;
  const_reference other;
  size_type __n_00;
  
  bVar1 = TableRef::Equals(&this->super_TableRef,other_p);
  if (bVar1) {
    pPVar3 = TableRef::Cast<duckdb::PivotRef>(other_p);
    pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       (&this->source);
    pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                       (&pPVar3->source);
    iVar2 = (*pTVar4->_vptr_TableRef[3])(pTVar4,pTVar5);
    if ((((char)iVar2 != '\0') &&
        (bVar1 = ParsedExpression::ListEquals(&this->aggregates,&pPVar3->aggregates), bVar1)) &&
       ((long)(this->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
              .super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
              .super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl
              .super__Vector_impl_data._M_start ==
        (long)(pPVar3->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pPVar3->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start)) {
      if ((this->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
          super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
          super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          this_00 = vector<duckdb::PivotColumn,_true>::operator[](&this->pivots,__n_00);
          other = vector<duckdb::PivotColumn,_true>::operator[](&pPVar3->pivots,__n_00);
          bVar1 = PivotColumn::Equals(this_00,other);
          if (!bVar1) {
            return false;
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)(((long)(this->pivots).
                                         super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                         .
                                         super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->pivots).
                                         super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                         .
                                         super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0x6db6db6db6db6db7));
      }
      __first1 = (this->unpivot_names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      __last1 = (this->unpivot_names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __first2 = (pPVar3->unpivot_names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (((((long)__last1 - (long)__first1 ==
             (long)(pPVar3->unpivot_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
           (bVar1 = ::std::__equal<false>::
                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                              (__first1,__last1,__first2), bVar1)) &&
          ((__n = (this->super_TableRef).alias._M_string_length,
           __n == (pPVar3->super_TableRef).alias._M_string_length &&
           ((__n == 0 ||
            (iVar2 = bcmp((this->super_TableRef).alias._M_dataplus._M_p,
                          (pPVar3->super_TableRef).alias._M_dataplus._M_p,__n), iVar2 == 0)))))) &&
         (bVar1 = ::std::operator!=(&(this->groups).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ,&(pPVar3->groups).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ), !bVar1)) {
        return this->include_nulls == pPVar3->include_nulls;
      }
    }
  }
  return false;
}

Assistant:

bool PivotRef::Equals(const TableRef &other_p) const {
	if (!TableRef::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<PivotRef>();
	if (!source->Equals(*other.source)) {
		return false;
	}
	if (!ParsedExpression::ListEquals(aggregates, other.aggregates)) {
		return false;
	}
	if (pivots.size() != other.pivots.size()) {
		return false;
	}
	for (idx_t i = 0; i < pivots.size(); i++) {
		if (!pivots[i].Equals(other.pivots[i])) {
			return false;
		}
	}
	if (unpivot_names != other.unpivot_names) {
		return false;
	}
	if (alias != other.alias) {
		return false;
	}
	if (groups != other.groups) {
		return false;
	}
	if (include_nulls != other.include_nulls) {
		return false;
	}
	return true;
}